

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O3

void __thiscall Company::changeBoss(Company *this)

{
  Boss *pBVar1;
  int iVar2;
  Employee *this_00;
  long lVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = Employee::efficiency(&this->boss->super_Employee);
  if (dVar4 < 40.0) {
    this_00 = maxEfficiency(this);
    iVar2 = Boss::getNumberOfEmployees(this->boss);
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        dVar4 = Employee::efficiency(this->employees[lVar3]);
        dVar5 = Employee::efficiency(this_00);
        if ((dVar4 == dVar5) && (!NAN(dVar4) && !NAN(dVar5))) {
          iVar2 = Boss::getNumberOfEmployees(this->boss);
          pBVar1 = this->boss;
          this->boss = (Boss *)this->employees[lVar3];
          this->employees[lVar3] = &pBVar1->super_Employee;
          Boss::setNumberOfEmployees(this->boss,iVar2);
          return;
        }
        lVar3 = lVar3 + 1;
        iVar2 = Boss::getNumberOfEmployees(this->boss);
      } while (lVar3 < iVar2);
    }
  }
  return;
}

Assistant:

void Company::changeBoss() {

    if (boss->efficiency() < 40.0) {
        Employee *max = maxEfficiency(); // get the max efficiency
        for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
            if (employees[i]->efficiency() == max->efficiency()) {
                int numberOfEmployee = boss->getNumberOfEmployees();
                Employee *temp = boss; // store the value of boss
                boss = static_cast<Boss *>(employees[i]); // assign the max efficiency employee to boss with casting
                employees[i] = temp; // assign the boss which we stored earlier to that employee
                boss->setNumberOfEmployees(numberOfEmployee); // set the number of employees for the new boss
                break;
            }
        }
    }
}